

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O0

void __thiscall
leveldb::VersionSet::GetRange
          (VersionSet *this,
          vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *inputs,
          InternalKey *smallest,InternalKey *largest)

{
  value_type pFVar1;
  bool bVar2;
  int iVar3;
  FileMetaData *pFVar4;
  const_reference ppFVar5;
  FileMetaData *f;
  size_t i;
  InternalKey *largest_local;
  InternalKey *smallest_local;
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *inputs_local;
  VersionSet *this_local;
  
  bVar2 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::empty
                    (inputs);
  if (((bVar2 ^ 0xffU) & 1) != 0) {
    InternalKey::Clear(smallest);
    InternalKey::Clear(largest);
    for (f = (FileMetaData *)0x0;
        pFVar4 = (FileMetaData *)
                 std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::
                 size(inputs), f < pFVar4; f = (FileMetaData *)((long)&f->refs + 1)) {
      ppFVar5 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::
                operator[](inputs,(size_type)f);
      pFVar1 = *ppFVar5;
      if (f == (FileMetaData *)0x0) {
        InternalKey::operator=(smallest,&pFVar1->smallest);
        InternalKey::operator=(largest,&pFVar1->largest);
      }
      else {
        iVar3 = InternalKeyComparator::Compare(&this->icmp_,&pFVar1->smallest,smallest);
        if (iVar3 < 0) {
          InternalKey::operator=(smallest,&pFVar1->smallest);
        }
        iVar3 = InternalKeyComparator::Compare(&this->icmp_,&pFVar1->largest,largest);
        if (0 < iVar3) {
          InternalKey::operator=(largest,&pFVar1->largest);
        }
      }
    }
    return;
  }
  __assert_fail("!inputs.empty()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/version_set.cc"
                ,0x4b4,
                "void leveldb::VersionSet::GetRange(const std::vector<FileMetaData *> &, InternalKey *, InternalKey *)"
               );
}

Assistant:

void VersionSet::GetRange(const std::vector<FileMetaData*>& inputs,
                          InternalKey* smallest, InternalKey* largest) {
  assert(!inputs.empty());
  smallest->Clear();
  largest->Clear();
  for (size_t i = 0; i < inputs.size(); i++) {
    FileMetaData* f = inputs[i];
    if (i == 0) {
      *smallest = f->smallest;
      *largest = f->largest;
    } else {
      if (icmp_.Compare(f->smallest, *smallest) < 0) {
        *smallest = f->smallest;
      }
      if (icmp_.Compare(f->largest, *largest) > 0) {
        *largest = f->largest;
      }
    }
  }
}